

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tapfail.cpp
# Opt level: O0

void __thiscall tst_qpromise_tapfail::fulfilled_void(tst_qpromise_tapfail *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool local_5a;
  bool local_59 [5];
  int local_54 [5];
  undefined1 *local_40;
  QPromise<void> local_38;
  undefined1 local_28 [8];
  QPromise<void> p;
  int value;
  tst_qpromise_tapfail *this_local;
  
  p.super_QPromiseBase<void>.m_d.d._4_4_ = -1;
  QtPromise::QPromise<void>::resolve();
  local_40 = (undefined1 *)((long)&p.super_QPromiseBase<void>.m_d.d + 4);
  QtPromise::QPromiseBase<void>::tapFail<tst_qpromise_tapfail::fulfilled_void()::__0>
            ((QPromiseBase<void> *)local_28,(anon_class_8_1_a8c68091)&local_38);
  QtPromise::QPromise<void>::~QPromise(&local_38);
  local_54[1] = 0xffffffff;
  local_54[0] = 0x2a;
  iVar3 = waitForValue<int>((QPromise<void> *)local_28,local_54 + 1,local_54);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1, 42)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                          ,0x32);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_59[0] = QtPromise::QPromiseBase<void>::isFulfilled((QPromiseBase<void> *)local_28);
    local_5a = true;
    bVar2 = QTest::qCompare<bool,bool>
                      (local_59,&local_5a,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                       ,0x33);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar1 = QTest::qCompare(p.super_QPromiseBase<void>.m_d.d._4_4_,-1,"value","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                              ,0x34);
      if ((bVar1 & 1) == 0) {
        local_59[1] = true;
        local_59[2] = false;
        local_59[3] = false;
        local_59[4] = false;
      }
      else {
        local_59[1] = false;
        local_59[2] = false;
        local_59[3] = false;
        local_59[4] = false;
      }
    }
    else {
      local_59[1] = true;
      local_59[2] = false;
      local_59[3] = false;
      local_59[4] = false;
    }
  }
  else {
    local_59[1] = true;
    local_59[2] = false;
    local_59[3] = false;
    local_59[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_28);
  return;
}

Assistant:

void tst_qpromise_tapfail::fulfilled_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::resolve().tapFail([&]() {
        value = 43;
    });

    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, -1);
}